

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::clear_no_resize(dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this)

{
  int iVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar10;
  
  auVar3 = _DAT_00a8f670;
  if (this->num_elements == 0) {
    uVar4 = this->num_buckets;
  }
  else {
    uVar4 = this->num_buckets;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      piVar2 = this->table;
      iVar1 = (this->key_info).empty_key;
      lVar10 = uVar4 - 1;
      auVar6._8_4_ = (int)lVar10;
      auVar6._0_8_ = lVar10;
      auVar6._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar5 = 0;
      auVar6 = auVar6 ^ _DAT_00a8f670;
      auVar9 = _DAT_00a8f650;
      auVar11 = _DAT_00a8f660;
      do {
        auVar12 = auVar11 ^ auVar3;
        iVar7 = auVar6._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar7 && auVar6._0_4_ < auVar12._0_4_ || iVar7 < auVar12._4_4_
                    ) & 1)) {
          piVar2[uVar5] = iVar1;
        }
        if ((auVar12._12_4_ != auVar6._12_4_ || auVar12._8_4_ <= auVar6._8_4_) &&
            auVar12._12_4_ <= auVar6._12_4_) {
          piVar2[uVar5 + 1] = iVar1;
        }
        auVar12 = auVar9 ^ auVar3;
        iVar13 = auVar12._4_4_;
        if (iVar13 <= iVar7 && (iVar13 != iVar7 || auVar12._0_4_ <= auVar6._0_4_)) {
          piVar2[uVar5 + 2] = iVar1;
          piVar2[uVar5 + 3] = iVar1;
        }
        uVar5 = uVar5 + 4;
        lVar10 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar10 + 4;
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar10 + 4;
      } while ((uVar4 + 3 & 0xfffffffffffffffc) != uVar5);
    }
  }
  fVar8 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar4;
  uVar5 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar8 = (float)uVar4 *
          (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar4 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  this->num_elements = 0;
  return;
}

Assistant:

void clear_no_resize() {
    if (num_elements > 0) {
      assert(table);
      destroy_buckets(0, num_buckets);
      fill_range_with_empty(table, num_buckets);
    }
    // don't consider to shrink before another erase()
    settings.reset_thresholds(bucket_count());
    num_elements = 0;
    num_deleted = 0;
  }